

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_view.hpp
# Opt level: O1

file_view_sptr __thiscall
vfs::open_read_write_view
          (vfs *this,path *fileName,file_creation_options creationOptions,file_flags fileFlags,
          file_attributes fileAttributes,int64_t viewSize)

{
  posix_file *this_00;
  stream_interface<vfs::file_view_interface<vfs::posix_file_view>> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  file_view_sptr fVar2;
  file_sptr spFile;
  shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>_> local_48;
  int64_t local_38;
  
  local_38 = viewSize;
  this_00 = (posix_file *)operator_new(0x28);
  posix_file::posix_file(this_00,fileName,read_write,creationOptions,fileFlags,fileAttributes);
  local_48.
  super___shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vfs::stream_interface<vfs::file_interface<vfs::posix_file>>*>
            (&local_48.
              super___shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(stream_interface<vfs::file_interface<vfs::posix_file>_> *)this_00);
  if (*(native_handle *)
       ((long)local_48.
              super___shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 0x20) == -1) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    _Var1._M_pi = extraout_RDX;
  }
  else {
    this_01 = (stream_interface<vfs::file_view_interface<vfs::posix_file_view>> *)operator_new(0x60)
    ;
    stream_interface<vfs::file_view_interface<vfs::posix_file_view>>::
    stream_interface<std::shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>>>,long&>
              (this_01,&local_48,&local_38);
    *(stream_interface<vfs::file_view_interface<vfs::posix_file_view>> **)this = this_01;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),
               (stream_interface<vfs::file_view_interface<vfs::posix_file_view>_> *)this_01);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_48.
      super___shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  fVar2.
  super___shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  fVar2.
  super___shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (file_view_sptr)
         fVar2.
         super___shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline auto open_read_write_view
    (
        const path              &fileName,
        file_creation_options   creationOptions,
        file_flags              fileFlags = file_flags::none,
        file_attributes         fileAttributes = file_attributes::normal,
        int64_t                 viewSize = 0
    )
    {
        auto spFile = open_read_write(fileName, creationOptions, fileFlags, fileAttributes);
        return spFile->isValid() ? file_view_sptr(new file_view_stream(std::move(spFile), viewSize)) : nullptr;
    }